

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  int *piVar5;
  char *pcVar6;
  string *psVar7;
  bool bVar8;
  bool bVar9;
  option *poVar10;
  allocator local_ec;
  Options local_eb;
  ulong local_e8;
  string local_e0;
  stat st;
  
  local_e8 = 0;
  poVar10 = main::longOpts;
  bVar9 = false;
  bVar8 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        do {
          iVar3 = argc;
          uVar4 = getopt_long(argc,argv,"xjv",main::longOpts,0);
          iVar2 = (int)uVar4;
        } while (iVar2 == 0);
        if (iVar2 == -1) {
          local_eb.json = SUB81(local_e8,0);
          poVar10 = (option *)(long)_optind;
          local_eb.extract = bVar9;
          local_eb.verbose = bVar8;
          goto LAB_0011d6b2;
        }
        if (iVar2 != 0x6a) break;
        local_e8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
      }
      if (iVar2 != 0x76) break;
      bVar8 = true;
    }
    if (iVar2 != 0x78) break;
    bVar9 = true;
  }
  if (iVar2 == 0x1337) {
    usage(iVar3,argv);
LAB_0011d778:
    __stream = _stderr;
    pcVar1 = argv[(long)poVar10];
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(__stream,"%s: %s\n",pcVar1,pcVar6);
  }
  exit(1);
LAB_0011d6b2:
  if ((long)argc <= (long)poVar10) {
    return 0;
  }
  iVar3 = stat(argv[(long)poVar10],(stat *)&st);
  if (iVar3 < 0) goto LAB_0011d778;
  if (bVar9 == false) {
    if ((local_e8 & 1) != 0) {
      psVar7 = &local_e0;
      std::__cxx11::string::string((string *)&local_e0,argv[(long)poVar10],&local_ec);
      json((Options *)psVar7,&local_e0);
      goto LAB_0011d712;
    }
    std::__cxx11::string::string((string *)&local_e0,argv[(long)poVar10],&local_ec);
    iVar3 = dump(&local_eb,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    if (iVar3 != 0) {
      return 1;
    }
  }
  else {
    psVar7 = &local_e0;
    std::__cxx11::string::string((string *)&local_e0,argv[(long)poVar10],&local_ec);
    extract((Options *)psVar7,&local_e0);
LAB_0011d712:
    std::__cxx11::string::~string((string *)&local_e0);
  }
  poVar10 = (option *)((long)&poVar10->name + 1);
  goto LAB_0011d6b2;
}

Assistant:

int main(int argc, char** argv) {
  Options opts;

  while (1) {
    static struct option longOpts[] = {
      {"extract", no_argument, nullptr, 'x'},
      {"json",    no_argument, nullptr, 'j'},
      {"verbose", no_argument, nullptr, 'v'},
      {"help",    no_argument, nullptr, 0x1337},
      {nullptr,   0,           nullptr, 0},
    };

    auto c = getopt_long(argc, argv, "xjv", longOpts, nullptr);
    if (c == -1) {
      break;
    }

    switch (c) {
    case 0:
      break;
    case 'x':
      opts.extract = true;
      break;
    case 'j':
      opts.json = true;
      break;
    case 'v':
      opts.verbose = true;
      break;
    case 0x1337:
      usage(argc, argv);
      break;
    default:
      exit(1);
    }
  }

  for (auto i = optind; i < argc; i++) {
    struct stat st;
    auto rv = stat(argv[i], &st);
    if (rv < 0) {
      fprintf(stderr, "%s: %s\n", argv[i], strerror(errno));
      exit(1);
    }
    if (opts.extract) {
      rv = extract(opts, argv[i]);
      if (rv != 0) {
        return rv;
      }
    } else {
      if (opts.json) {
        rv = json(opts, argv[i]);
        if (rv != 0) {
          return rv;
        }
        continue;
      }
      rv = dump(opts, argv[i]);
      if (rv != 0) {
        return rv;
      }
    }
  }

  return 0;
}